

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

CGraph * __thiscall Escape::CGraph::renameByDegreeOrder(CGraph *__return_storage_ptr__,CGraph *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  Pair *__first;
  void *pvVar6;
  void *pvVar7;
  VertexIdx new_nbr;
  VertexIdx old_nbr;
  EdgeIdx pos;
  VertexIdx old_label;
  VertexIdx new_label;
  EdgeIdx current;
  VertexIdx i_1;
  VertexIdx i;
  VertexIdx *inverse;
  VertexIdx *mapping;
  Pair *deg_info;
  CGraph *this_local;
  
  newCGraph(__return_storage_ptr__,this->nVertices,this->nEdges);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->nVertices;
  uVar5 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __first = (Pair *)operator_new__(uVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->nVertices;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->nVertices;
  uVar5 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar5);
  for (i_1 = 0; i_1 < this->nVertices; i_1 = i_1 + 1) {
    __first[i_1].first = i_1;
    __first[i_1].second = this->offsets[i_1 + 1] - this->offsets[i_1];
  }
  std::sort<Escape::Pair*,bool(*)(Escape::Pair,Escape::Pair)>
            (__first,__first + this->nVertices,pairCompareSecond);
  for (current = 0; current < this->nVertices; current = current + 1) {
    *(EdgeIdx *)((long)pvVar6 + __first[current].first * 8) = current;
    *(VertexIdx *)((long)pvVar7 + current * 8) = __first[current].first;
  }
  *__return_storage_ptr__->offsets = 0;
  new_label = 0;
  for (old_label = 0; old_label < this->nVertices; old_label = old_label + 1) {
    lVar1 = *(long *)((long)pvVar7 + old_label * 8);
    for (old_nbr = this->offsets[lVar1]; old_nbr < this->offsets[lVar1 + 1]; old_nbr = old_nbr + 1)
    {
      __return_storage_ptr__->nbors[new_label] =
           *(VertexIdx *)((long)pvVar6 + this->nbors[old_nbr] * 8);
      new_label = new_label + 1;
    }
    __return_storage_ptr__->offsets[old_label + 1] = new_label;
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  if (__first != (Pair *)0x0) {
    operator_delete__(__first);
  }
  return __return_storage_ptr__;
}

Assistant:

CGraph CGraph::renameByDegreeOrder() const {
    CGraph ret = newCGraph(nVertices, nEdges);
    Pair *deg_info = new Pair[nVertices];

    VertexIdx *mapping = new VertexIdx[nVertices];
    VertexIdx *inverse = new VertexIdx[nVertices];

    // Construct array of pairs, storing old vertex label and degree
    for (VertexIdx i = 0; i < nVertices; i++) {
        deg_info[i].first = i;
        deg_info[i].second = offsets[i + 1] - offsets[i];
    }

    // sort the pairs by degree (if degree is same, sort by old vertex label)
    std::sort(deg_info, deg_info + nVertices, Escape::pairCompareSecond);

    // Construct the mapping of old vertex label to new vertex label
    // So mapping[i] is what i is mapped to
    // And inverse[i] is what maps to i
    for (VertexIdx i = 0; i < nVertices; i++) {
        mapping[deg_info[i].first] = i;
        inverse[i] = deg_info[i].first;
    }

    // Initialize offsets of output CGraph
    ret.offsets[0] = 0;
    EdgeIdx current = 0;


    // Loop over new vertices
    for (VertexIdx new_label = 0; new_label < nVertices; new_label++) {
        VertexIdx old_label = inverse[new_label]; // corresponding old label for new vertices
        for (EdgeIdx pos = offsets[old_label]; pos < offsets[old_label + 1]; pos++) // loop over neighbors of old label
        {
            VertexIdx old_nbr = nbors[pos];
            VertexIdx new_nbr = mapping[old_nbr]; //corresponding new neighbor
            ret.nbors[current] = new_nbr; // insert new neighbor in nbors of output
            current++;
        }
        ret.offsets[new_label +
                    1] = current; // all neighbors of new_label have been added, so we set offset for new_label+1
    }

    delete[] mapping;
    delete[] inverse;
    delete[] deg_info;
    return ret;
}